

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O3

int consume_data(j_decompress_ptr cinfo)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_d_coef_controller *pjVar3;
  long lVar4;
  jpeg_entropy_decoder *pjVar5;
  boolean bVar6;
  int iVar7;
  JBLOCKARRAY ppaJVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  _func_void_j_decompress_ptr *p_Var15;
  long lVar16;
  long lVar17;
  JBLOCKARRAY buffer [4];
  long alStack_58 [5];
  
  pjVar3 = cinfo->coef;
  if (0 < cinfo->comps_in_scan) {
    lVar17 = 0;
    do {
      JVar1 = cinfo->cur_comp_info[lVar17]->v_samp_factor;
      ppaJVar8 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,
                            (jvirt_barray_ptr)
                            (&pjVar3[3].decompress_data)
                            [cinfo->cur_comp_info[lVar17]->component_index],
                            cinfo->input_iMCU_row * JVar1,JVar1,1);
      alStack_58[lVar17] = (long)ppaJVar8;
      lVar17 = lVar17 + 1;
    } while (lVar17 < cinfo->comps_in_scan);
  }
  iVar7 = *(int *)((long)&pjVar3[1].start_input_pass + 4);
  lVar17 = (long)iVar7;
  iVar11 = *(int *)&pjVar3[1].consume_data;
  if (iVar7 < iVar11) {
    uVar12 = *(uint *)&pjVar3[1].start_input_pass;
    uVar9 = cinfo->MCUs_per_row;
    do {
      if (uVar12 < uVar9) {
        do {
          iVar7 = cinfo->comps_in_scan;
          if (0 < (long)iVar7) {
            lVar10 = 0;
            iVar11 = 0;
            do {
              lVar13 = (long)cinfo->cur_comp_info[lVar10]->MCU_height;
              if (0 < lVar13) {
                iVar2 = cinfo->cur_comp_info[lVar10]->MCU_width;
                lVar4 = alStack_58[lVar10];
                lVar14 = 0;
                do {
                  if (0 < iVar2) {
                    p_Var15 = (_func_void_j_decompress_ptr *)
                              (*(long *)(lVar4 + lVar17 * 8 + lVar14 * 8) +
                              (ulong)(iVar2 * uVar12) * 0x80);
                    lVar16 = 0;
                    do {
                      (&pjVar3[1].start_output_pass)[iVar11 + lVar16] = p_Var15;
                      p_Var15 = p_Var15 + 0x80;
                      lVar16 = lVar16 + 1;
                    } while (iVar2 != (int)lVar16);
                    iVar11 = iVar11 + (int)lVar16;
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar14 != lVar13);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != iVar7);
          }
          pjVar5 = cinfo->entropy;
          if (pjVar5->insufficient_data == 0) {
            cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
          }
          bVar6 = (*pjVar5->decode_mcu)(cinfo,(JBLOCKROW *)&pjVar3[1].start_output_pass);
          if (bVar6 == 0) {
            *(int *)((long)&pjVar3[1].start_input_pass + 4) = (int)lVar17;
            *(uint *)&pjVar3[1].start_input_pass = uVar12;
            return 0;
          }
          uVar12 = uVar12 + 1;
          uVar9 = cinfo->MCUs_per_row;
        } while (uVar12 < uVar9);
        iVar11 = *(int *)&pjVar3[1].consume_data;
      }
      *(undefined4 *)&pjVar3[1].start_input_pass = 0;
      lVar17 = lVar17 + 1;
      uVar12 = 0;
    } while (lVar17 < iVar11);
  }
  uVar12 = cinfo->input_iMCU_row + 1;
  cinfo->input_iMCU_row = uVar12;
  if (uVar12 < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    iVar7 = 3;
  }
  else {
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    iVar7 = 4;
  }
  return iVar7;
}

Assistant:

METHODDEF(int)
consume_data(j_decompress_ptr cinfo)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[compptr->component_index],
       cinfo->input_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, TRUE);
    /* Note: entropy decoder expects buffer to be zeroed,
     * but this is handled automatically by the memory manager
     * because we requested a pre-zeroed array.
     */
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num < cinfo->MCUs_per_row;
         MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;                 /* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
        compptr = cinfo->cur_comp_info[ci];
        start_col = MCU_col_num * compptr->MCU_width;
        for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
          buffer_ptr = buffer[ci][yindex + yoffset] + start_col;
          for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
            coef->MCU_buffer[blkn++] = buffer_ptr++;
          }
        }
      }
      if (!cinfo->entropy->insufficient_data)
        cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
      /* Try to fetch the MCU. */
      if (!(*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->MCU_ctr = MCU_col_num;
        return JPEG_SUSPENDED;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}